

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ismine_tests.cpp
# Opt level: O1

ScriptPubKeyMan *
wallet::ismine_tests::CreateDescriptor(CWallet *keystore,string *desc_str,bool success)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this;
  ScriptPubKeyMan **ppSVar2;
  undefined8 uVar3;
  ScriptPubKeyMan *pSVar4;
  iterator pvVar5;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  shared_ptr<Descriptor> descriptor;
  const_string msg;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  parsed_descs;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock4;
  WalletDescriptor w_desc;
  string error;
  FlatSigningProvider keys;
  int32_t next_index;
  check_type cVar6;
  ScriptPubKeyMan *local_2c8;
  element_type local_2c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  local_280;
  undefined1 local_268 [16];
  string local_258;
  undefined1 local_238 [8];
  bool local_230;
  undefined7 uStack_22f;
  undefined1 *local_228;
  undefined1 *local_220;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_1f0;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_1b8;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_180;
  string local_148;
  FlatSigningProvider local_128;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  CWallet::SetWalletFlag(keystore,0x400000000);
  local_128.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_128.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
  local_128.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FlatSigningProvider_013bcda8;
  local_128.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_128.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_128.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_128.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_128.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  local_128.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_128.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_128.pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_128.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_128.origins._M_t._M_impl.super__Rb_tree_header._M_header;
  local_128.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_128.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_128.origins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_128.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_128.keys._M_t._M_impl.super__Rb_tree_header._M_header;
  local_128.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_128.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_128.keys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_128.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_128.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header;
  local_128.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_128.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_128.tr_trees._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  paVar1 = &local_148.field_2;
  local_148._M_string_length = 0;
  local_148.field_2._M_local_buf[0] = '\0';
  pvVar5 = (iterator)0x0;
  local_148._M_dataplus._M_p = (pointer)paVar1;
  local_128.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_128.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_128.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_128.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_128.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_128.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_128.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_128.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_128.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_128.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Parse(&local_280,desc_str,&local_128,&local_148,false);
  local_290 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/ismine_tests.cpp"
  ;
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1e;
  file.m_begin = (iterator)&local_290;
  msg.m_end = in_R9;
  msg.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2a0,msg);
  local_258._M_dataplus._M_p._0_1_ =
       (local_280.
        super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
       local_280.
       super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) != success;
  local_258._M_string_length = 0;
  local_258.field_2._M_allocated_capacity = 0;
  local_220 = local_268;
  local_268._0_8_ = "success == (!parsed_descs.empty())";
  local_268._8_8_ = "";
  local_230 = false;
  local_238 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_228 = boost::unit_test::lazy_ostream::inst;
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/ismine_tests.cpp"
  ;
  local_2a8 = "";
  next_index = 0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_258,(lazy_ostream *)local_238,1,0,WARN,_cVar6,
             (size_t)&local_2b0,0x1e);
  this = &local_258.field_2;
  boost::detail::shared_count::~shared_count((shared_count *)&this->_M_allocated_capacity);
  if (success) {
    if (local_280.
        super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_280.
        super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        uVar3 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,0,0);
        std::unique_lock<std::recursive_mutex>::~unique_lock
                  ((unique_lock<std::recursive_mutex> *)local_268);
        WalletDescriptor::~WalletDescriptor((WalletDescriptor *)local_238);
        std::
        vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
        ::~vector(&local_280);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != paVar1) {
          operator_delete(local_148._M_dataplus._M_p,
                          CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                                   local_148.field_2._M_local_buf[0]) + 1);
        }
        FlatSigningProvider::~FlatSigningProvider(&local_128);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          _Unwind_Resume(uVar3);
        }
      }
      goto LAB_007d5448;
    }
    std::__shared_ptr<Descriptor,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Descriptor,std::default_delete<Descriptor>,void>
              ((__shared_ptr<Descriptor,(__gnu_cxx::_Lock_policy)2> *)&local_2c0,
               local_280.
               super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
    descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &local_2c0;
    WalletDescriptor::WalletDescriptor((WalletDescriptor *)local_238,descriptor,0,1,0,next_index);
    if (local_2b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b8);
    }
    local_268._0_8_ = &keystore->cs_wallet;
    local_268._8_8_ = local_268._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_268);
    local_258._M_dataplus._M_p = (pointer)this;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"");
    local_2c8 = CWallet::AddWalletDescriptor
                          (keystore,(WalletDescriptor *)local_238,&local_128,&local_258,false);
    ppSVar2 = inline_assertion_check<true,wallet::ScriptPubKeyMan*>
                        (&local_2c8,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/ismine_tests.cpp"
                         ,0x28,"CreateDescriptor",
                         "keystore.AddWalletDescriptor(w_desc, keys, \"\", false)");
    pSVar4 = *ppSVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != this) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)local_268);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_180);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_1b8);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_1f0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(uStack_22f,local_230) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(uStack_22f,local_230));
    }
  }
  else {
    pSVar4 = (ScriptPubKeyMan *)0x0;
  }
  std::
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  ::~vector(&local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != paVar1) {
    operator_delete(local_148._M_dataplus._M_p,
                    CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                             local_148.field_2._M_local_buf[0]) + 1);
  }
  std::
  _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
  ::~_Rb_tree(&local_128.tr_trees._M_t);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  ::~_Rb_tree(&local_128.keys._M_t);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  ::~_Rb_tree(&local_128.origins._M_t);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
  ::~_Rb_tree(&local_128.pubkeys._M_t);
  std::
  _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  ::~_Rb_tree(&local_128.scripts._M_t);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return pSVar4;
  }
LAB_007d5448:
  __stack_chk_fail();
}

Assistant:

wallet::ScriptPubKeyMan* CreateDescriptor(CWallet& keystore, const std::string& desc_str, const bool success)
{
    keystore.SetWalletFlag(WALLET_FLAG_DESCRIPTORS);

    FlatSigningProvider keys;
    std::string error;
    auto parsed_descs = Parse(desc_str, keys, error, false);
    BOOST_CHECK(success == (!parsed_descs.empty()));
    if (!success) return nullptr;
    auto& desc = parsed_descs.at(0);

    const int64_t range_start = 0, range_end = 1, next_index = 0, timestamp = 1;

    WalletDescriptor w_desc(std::move(desc), timestamp, range_start, range_end, next_index);

    LOCK(keystore.cs_wallet);

    return Assert(keystore.AddWalletDescriptor(w_desc, keys,/*label=*/"", /*internal=*/false));
}